

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256.c
# Opt level: O2

_Bool Hacl_Bignum256_mod(uint64_t *n,uint64_t *a,uint64_t *res)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  _Bool _Var11;
  uint64_t *b;
  uint64_t r2 [4];
  
  uVar10 = *n;
  uVar1 = FStar_UInt64_eq_mask(1,uVar10);
  uVar2 = FStar_UInt64_gte_mask(1,uVar10);
  uVar6 = n[1];
  uVar3 = FStar_UInt64_eq_mask(0,uVar6);
  uVar4 = FStar_UInt64_gte_mask(0,uVar6);
  uVar6 = n[2];
  uVar5 = FStar_UInt64_eq_mask(0,uVar6);
  uVar6 = FStar_UInt64_gte_mask(0,uVar6);
  b = (uint64_t *)n[3];
  uVar7 = FStar_UInt64_eq_mask(0,(uint64_t)b);
  uVar8 = FStar_UInt64_gte_mask(0,(uint64_t)b);
  uVar9 = Hacl_Bignum_Lib_bn_get_top_index_u64((uint32_t)n,b);
  _Var11 = (_Bool)((~(uVar8 | uVar7) |
                   (~(uVar6 | uVar5) | (~(uVar4 | uVar3) | ~(uVar2 | uVar1) & uVar3) & uVar5) &
                   uVar7) == 0xffffffffffffffff & (byte)uVar10);
  if (_Var11 == true) {
    r2[2] = 0;
    r2[3] = 0;
    r2[0] = 0;
    r2[1] = 0;
    precompr2((int)uVar9 << 6,n,r2);
    uVar10 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(uVar10);
    bn_slow_precomp(n,uVar10,r2,a,res);
  }
  else {
    res[2] = 0;
    res[3] = 0;
    *res = 0;
    res[1] = 0;
  }
  return _Var11;
}

Assistant:

bool Hacl_Bignum256_mod(uint64_t *n, uint64_t *a, uint64_t *res)
{
  uint64_t one[4U] = { 0U };
  memset(one, 0U, 4U * sizeof (uint64_t));
  one[0U] = 1ULL;
  uint64_t bit0 = n[0U] & 1ULL;
  uint64_t m0 = 0ULL - bit0;
  uint64_t acc = 0ULL;
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint64_t beq = FStar_UInt64_eq_mask(one[i], n[i]);
    uint64_t blt = ~FStar_UInt64_gte_mask(one[i], n[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFFFFFFFFFULL) | (~blt & 0ULL))););
  uint64_t m1 = acc;
  uint64_t is_valid_m = m0 & m1;
  uint32_t nBits = 64U * (uint32_t)Hacl_Bignum_Lib_bn_get_top_index_u64(4U, n);
  if (is_valid_m == 0xFFFFFFFFFFFFFFFFULL)
  {
    uint64_t r2[4U] = { 0U };
    precompr2(nBits, n, r2);
    uint64_t mu = Hacl_Bignum_ModInvLimb_mod_inv_uint64(n[0U]);
    bn_slow_precomp(n, mu, r2, a, res);
  }
  else
  {
    memset(res, 0U, 4U * sizeof (uint64_t));
  }
  return is_valid_m == 0xFFFFFFFFFFFFFFFFULL;
}